

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O3

void __thiscall
license::License::add_parameter(License *this,string *param_name,string *param_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  License *pLVar3;
  string *__k;
  int iVar4;
  const_iterator cVar5;
  logic_error *plVar6;
  mapped_type *pmVar7;
  long lVar8;
  invalid_argument *piVar9;
  ostream *poVar10;
  long *plVar11;
  size_type *psVar12;
  char cVar13;
  ostream *poVar14;
  uint day;
  uint month;
  uint year;
  undefined1 local_204 [4];
  undefined1 local_200 [4];
  undefined1 local_1fc [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  License *local_1d8;
  string *local_1d0;
  undefined1 *local_1c8;
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)NO_OUTPUT_PARAM_abi_cxx11_,param_name);
  if (cVar5.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    lVar8 = std::__cxx11::string::find((char *)param_name,0x455fff,0);
    if (((lVar8 == -1) &&
        (lVar8 = std::__cxx11::string::find((char *)param_name,0x3ff195,0), lVar8 == -1)) &&
       (lVar8 = std::__cxx11::string::find((char *)param_name,0x3fe46e,0), lVar8 == -1)) {
      lVar8 = std::__cxx11::string::find((char *)param_name,0x429438,0);
      if ((lVar8 != -1) && (iVar4 = std::__cxx11::string::compare((char *)param_value), iVar4 == 0))
      {
        return;
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->values_map,param_name);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      return;
    }
    local_1d8 = this;
    local_1d0 = param_name;
    if (param_value->_M_string_length < 8) {
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar9,"Date string too small for known formats");
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    lVar8 = 0;
    while (iVar4 = __isoc99_sscanf((param_value->_M_dataplus)._M_p,
                                   *(undefined8 *)((long)&formats_abi_cxx11_ + lVar8),local_1fc,
                                   local_200,local_204), iVar4 != 3) {
      lVar8 = lVar8 + 0x20;
      if (lVar8 == 0x60) {
        piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1f8,"Date [",param_value);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar11;
        psVar12 = (size_type *)(plVar11 + 2);
        if ((size_type *)local_1a8[0]._M_dataplus._M_p == psVar12) {
          local_1a8[0].field_2._0_8_ = *psVar12;
          local_1a8[0].field_2._8_8_ = plVar11[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar12;
        }
        local_1a8[0]._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar9,(string *)local_1a8);
        __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    __k = local_1d0;
    pLVar3 = local_1d8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-",1);
    lVar8 = *(long *)poVar10;
    poVar14 = poVar10 + *(long *)(lVar8 + -0x18);
    if (poVar10[*(long *)(lVar8 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar14);
      poVar14[0xe1] = (ostream)0x1;
      lVar8 = *(long *)poVar10;
    }
    poVar14[0xe0] = (ostream)0x30;
    *(undefined8 *)(poVar10 + *(long *)(lVar8 + -0x18) + 0x10) = 2;
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-",1);
    lVar8 = *(long *)poVar10;
    poVar14 = poVar10 + *(long *)(lVar8 + -0x18);
    if (poVar10[*(long *)(lVar8 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar14);
      poVar14[0xe1] = (ostream)0x1;
      lVar8 = *(long *)poVar10;
    }
    poVar14[0xe0] = (ostream)0x30;
    *(undefined8 *)(poVar10 + *(long *)(lVar8 + -0x18) + 0x10) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pLVar3->values_map,__k);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)param_name);
    if (iVar4 == 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_feature_names);
      cVar13 = (char)&this->m_feature_names;
      lVar8 = std::__cxx11::string::find(cVar13,0x5b);
      if (((lVar8 == -1) && (lVar8 = std::__cxx11::string::find(cVar13,0x5d), lVar8 == -1)) &&
         ((lVar8 = std::__cxx11::string::find(cVar13,0x2f), lVar8 == -1 &&
          (lVar8 = std::__cxx11::string::find(cVar13,0x5c), lVar8 == -1)))) {
        return;
      }
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,
                 "feature name should not contain any of \'[ ] / \' characters. Parameter feature-namesvalue :"
                 ,"");
      std::operator+(local_1a8,&local_1f8,param_name);
      std::invalid_argument::invalid_argument(piVar9,(string *)local_1a8);
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar4 = std::__cxx11::string::compare((char *)param_name);
    if (iVar4 == 0) {
      paVar1 = &local_1a8[0].field_2;
      pcVar2 = (param_value->_M_dataplus)._M_p;
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar2,pcVar2 + param_value->_M_string_length);
      boost::filesystem::detail::status((detail *)&local_1f8,(path *)local_1a8,(error_code *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if ((uint)local_1f8._M_dataplus._M_p < 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Primary key ",0xc)
        ;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(param_value->_M_dataplus)._M_p,
                             param_value->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," not found.",0xb);
        std::endl<char,std::char_traits<char>>(poVar10);
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1f8,"Primary key [",param_value);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar11;
        psVar12 = (size_type *)(plVar11 + 2);
        if ((size_type *)local_1a8[0]._M_dataplus._M_p == psVar12) {
          local_1a8[0].field_2._0_8_ = *psVar12;
          local_1a8[0].field_2._8_8_ = plVar11[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar12;
        }
        local_1a8[0]._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::logic_error::logic_error(plVar6,(string *)local_1a8);
        __cxa_throw(plVar6,std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::_M_assign((string *)&this->m_private_key);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)param_name);
      if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)param_name), iVar4 != 0)) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a8,param_name," not recognized");
        std::logic_error::logic_error(plVar6,(string *)local_1a8);
        __cxa_throw(plVar6,std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  return;
}

Assistant:

void License::add_parameter(const std::string &param_name, const std::string &param_value) {
	if (NO_OUTPUT_PARAM.find(param_name) == NO_OUTPUT_PARAM.end()) {
		if (param_name.find("date") != std::string::npos || param_name.find(PARAM_EXPIRY_DATE) != std::string::npos ||
			param_name.find(PARAM_BEGIN_DATE) != std::string::npos) {
			values_map[param_name] = normalize_date(param_value);
		} else if (param_name.find("version") != std::string::npos) {
			if (param_value != "0") {
				values_map[param_name] = param_value;
			}
		} else {
			values_map[param_name] = param_value;
		}
	} else if (PARAM_FEATURE_NAMES == param_name) {
		m_feature_names = param_value;
		if (m_feature_names.find('[') != std::string::npos || m_feature_names.find(']') != std::string::npos ||
			m_feature_names.find('/') != std::string::npos || m_feature_names.find('\\') != std::string::npos) {
			throw invalid_argument(
				string("feature name should not contain any of '[ ] / \' characters. Parameter " PARAM_FEATURE_NAMES
					   "value :") +
				param_name);
		}
	} else if (PARAM_PRIMARY_KEY == param_name) {
		if (!fs::exists(param_value)) {
			cerr << "Primary key " << param_value << " not found." << endl;
			throw logic_error("Primary key [" + param_value + "] not found");
		}
		m_private_key = param_value;
	} else if (PARAM_LICENSE_OUTPUT == param_name || PARAM_PROJECT_FOLDER == param_name) {
		// just ignore
	} else {
		throw logic_error(param_name + " not recognized");
	}
}